

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

undefined8 Catch::Detail::rawMemoryToString_abi_cxx11_(void *object,size_t size)

{
  _Setfill<char> _Var1;
  Arch AVar2;
  _Setw _Var3;
  ostream *poVar4;
  int in_EDX;
  long in_RSI;
  undefined8 in_RDI;
  ostringstream os;
  uchar *bytes;
  int inc;
  int end;
  int i;
  ostringstream local_1a8 [376];
  long local_30;
  int local_24;
  int local_20;
  int local_1c;
  long local_10;
  
  local_1c = 0;
  local_24 = 1;
  local_20 = in_EDX;
  local_10 = in_RSI;
  AVar2 = anon_unknown_1::Endianness::which();
  if (AVar2 == Little) {
    local_1c = local_20 + -1;
    local_24 = -1;
    local_20 = -1;
  }
  local_30 = local_10;
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  poVar4 = std::operator<<((ostream *)local_1a8,"0x");
  _Var1 = std::setfill<char>('0');
  poVar4 = std::operator<<(poVar4,_Var1._M_c);
  std::ostream::operator<<(poVar4,std::hex);
  for (; local_1c != local_20; local_1c = local_24 + local_1c) {
    _Var3 = std::setw(2);
    poVar4 = std::operator<<((ostream *)local_1a8,_Var3);
    std::ostream::operator<<(poVar4,(uint)*(byte *)(local_30 + local_1c));
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  return in_RDI;
}

Assistant:

std::string rawMemoryToString( const void *object, std::size_t size )
    {
        // Reverse order for little endian architectures
        int i = 0, end = static_cast<int>( size ), inc = 1;
        if( Endianness::which() == Endianness::Little ) {
            i = end-1;
            end = inc = -1;
        }

        unsigned char const *bytes = static_cast<unsigned char const *>(object);
        std::ostringstream os;
        os << "0x" << std::setfill('0') << std::hex;
        for( ; i != end; i += inc )
             os << std::setw(2) << static_cast<unsigned>(bytes[i]);
       return os.str();
    }